

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O0

CURLcode my_sha256_init(void *in)

{
  EVP_MD_CTX *ctx_00;
  int iVar1;
  undefined8 uVar2;
  EVP_MD *type;
  my_sha256_ctx *ctx;
  void *in_local;
  
  uVar2 = EVP_MD_CTX_new();
  *(undefined8 *)in = uVar2;
  if (*in == 0) {
    in_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    ctx_00 = *in;
    type = EVP_sha256();
    iVar1 = EVP_DigestInit_ex(ctx_00,type,(ENGINE *)0x0);
    if (iVar1 == 0) {
      EVP_MD_CTX_free(*in);
      in_local._4_4_ = CURLE_FAILED_INIT;
    }
    else {
      in_local._4_4_ = CURLE_OK;
    }
  }
  return in_local._4_4_;
}

Assistant:

static CURLcode my_sha256_init(void *in)
{
  my_sha256_ctx *ctx = (my_sha256_ctx *)in;
  ctx->openssl_ctx = EVP_MD_CTX_create();
  if(!ctx->openssl_ctx)
    return CURLE_OUT_OF_MEMORY;

  if(!EVP_DigestInit_ex(ctx->openssl_ctx, EVP_sha256(), NULL)) {
    EVP_MD_CTX_destroy(ctx->openssl_ctx);
    return CURLE_FAILED_INIT;
  }
  return CURLE_OK;
}